

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::vector<pbrt::LightHandle,_pstd::pmr::polymorphic_allocator<pbrt::LightHandle>_>::push_back
          (vector<pbrt::LightHandle,_pstd::pmr::polymorphic_allocator<pbrt::LightHandle>_> *this,
          LightHandle *value)

{
  size_t sVar1;
  LightHandle *pLVar2;
  size_t n;
  
  sVar1 = this->nAlloc;
  if (sVar1 == this->nStored) {
    n = 4;
    if (sVar1 != 0) {
      n = sVar1 * 2;
    }
    reserve(this,n);
  }
  pLVar2 = this->ptr;
  sVar1 = this->nStored;
  pLVar2[sVar1].
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits = 0;
  pLVar2[sVar1].
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits = (value->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits;
  this->nStored = sVar1 + 1;
  return;
}

Assistant:

void push_back(const T &value) {
        if (nAlloc == nStored)
            reserve(nAlloc == 0 ? 4 : 2 * nAlloc);

        alloc.construct(ptr + nStored, value);
        ++nStored;
    }